

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

void __thiscall
hwtest::pgraph::MthdCelsiusTexMatrixEnable::emulate_mthd(MthdCelsiusTexMatrixEnable *this)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar5 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4;
  uVar4 = (uint)(1 < uVar2);
  if (uVar5 == 0 && uVar4 == 0) {
    if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
      iVar1 = *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
      bVar3 = (char)(iVar1 << 4) + (char)iVar1 * -2;
      uVar2 = (uVar2 & 1) << (bVar3 & 0x3f | 1) |
              ~(uint)(1L << (bVar3 & 0x3f | 1)) &
              (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b = uVar2;
      if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x10000000) ==
          0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] = uVar2
        ;
      }
    }
    return;
  }
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.notify;
  if ((uVar2 & 0x70000000) != 0) {
    return;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.notify =
       uVar2 | (uVar5 | uVar4) << 0x1c;
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		if (val > 1)
			err |= 1;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.celsius_xf_misc_b, 1 + idx * 14, 1, val);
				if (!extr(exp.debug_d, 28, 1)) {
					exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
					exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
				}
			}
		}
	}